

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GLSL420Pack::GLSLTestBase::checkResults(GLSLTestBase *this,texture *color_texture)

{
  _func_int *p_Var1;
  undefined1 uVar2;
  long lVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  undefined1 local_198 [8];
  _func_int **local_190;
  undefined8 uStack_180;
  uint auStack_178 [22];
  ios_base local_120 [112];
  char acStack_b0 [152];
  int iVar3;
  
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_1b8,0x100);
  Utils::texture::get(color_texture,0x1908,0x1401,
                      local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  lVar4 = 0;
  do {
    if (local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4] != 0xff00ff00) {
      local_198 = (undefined1  [8])
                  ((this->super_TestBase).super_TestCase.m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_190,"Invalid texel: ",0xf);
      *(uint *)((long)auStack_178 + (long)local_190[-3]) =
           *(uint *)((long)auStack_178 + (long)local_190[-3]) & 0xffffffb5 | 8;
      p_Var1 = local_190[-3];
      if ((acStack_b0 + 1)[(long)p_Var1] == '\0') {
        std::ios::widen((char)(ostringstream *)&local_190 + (char)p_Var1);
        (acStack_b0 + 1)[(long)p_Var1] = '\x01';
      }
      acStack_b0[(long)p_Var1] = '0';
      *(undefined8 *)((long)&uStack_180 + (long)local_190[-3]) = 8;
      std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," at index: ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
      std::ios_base::~ios_base(local_120);
      uVar2 = 0;
      goto LAB_009d1578;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  iVar3 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
                    (this);
  uVar2 = (undefined1)iVar3;
LAB_009d1578:
  if (local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)uVar2;
}

Assistant:

bool GLSLTestBase::checkResults(Utils::texture& color_texture) const
{
	static const GLuint		 green_color	   = 0xff00ff00;
	const GLuint			 texture_data_size = m_color_texture_width * m_color_texture_height;
	std::vector<glw::GLuint> texture_data;

	texture_data.resize(texture_data_size);

	color_texture.get(m_color_texture_format, m_color_texture_type, &texture_data[0]);

	for (GLuint i = 0; i < texture_data_size; ++i)
	{
		if (green_color != texture_data[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid texel: " << std::setbase(16)
												<< std::setfill('0') << std::setw(8) << texture_data[i]
												<< " at index: " << i << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return verifyAdditionalResults();
}